

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::convert_mblur_to_nonmblur(Ref<embree::SceneGraph::Node> *node)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  Node *pNVar4;
  long lVar5;
  undefined8 uVar6;
  long *plVar7;
  long *plVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  long *plVar16;
  long *plVar17;
  long *plVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo);
  }
  if (plVar7 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar8 = (long *)0x0;
    }
    else {
      plVar8 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (plVar8 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar12 = (long *)0x0;
      }
      else {
        plVar12 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (plVar12 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar13 = (long *)0x0;
        }
        else {
          plVar13 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (plVar13 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar14 = (long *)0x0;
          }
          else {
            plVar14 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          if (plVar14 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              plVar15 = (long *)0x0;
            }
            else {
              plVar15 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            if (plVar15 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                plVar16 = (long *)0x0;
              }
              else {
                plVar16 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo,0
                                                );
              }
              if (plVar16 == (long *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  plVar17 = (long *)0x0;
                }
                else {
                  plVar17 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,
                                                   &SubdivMeshNode::typeinfo,0);
                }
                if (plVar17 == (long *)0x0) {
                  if (node->ptr == (Node *)0x0) {
                    plVar18 = (long *)0x0;
                  }
                  else {
                    plVar18 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,
                                                     &GridMeshNode::typeinfo,0);
                  }
                  if (plVar18 != (long *)0x0) {
                    (**(code **)(*plVar18 + 0x10))(plVar18);
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar18 + 0xe),1);
                    (**(code **)(*plVar18 + 0x18))();
                  }
                }
                else {
                  (**(code **)(*plVar17 + 0x10))(plVar17);
                  if (plVar17[0xf] != plVar17[0xe]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar17 + 0xe),1);
                  }
                  if (plVar17[0x12] != plVar17[0x11]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar17 + 0x11),1);
                  }
                }
                if (plVar17 != (long *)0x0) {
                  (**(code **)(*plVar17 + 0x18))();
                }
              }
              else {
                (**(code **)(*plVar16 + 0x10))(plVar16);
                if (plVar16[0x10] != plVar16[0xf]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar16 + 0xf),1);
                }
                if (plVar16[0x13] != plVar16[0x12]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(plVar16 + 0x12),1);
                }
              }
              if (plVar16 != (long *)0x0) {
                (**(code **)(*plVar16 + 0x18))(plVar16);
              }
            }
            else {
              (**(code **)(*plVar15 + 0x10))(plVar15);
              if (plVar15[0x10] != plVar15[0xf]) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)(plVar15 + 0xf),1);
              }
              if (plVar15[0x13] != plVar15[0x12]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar15 + 0x12),1);
              }
              if (plVar15[0x16] != plVar15[0x15]) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)(plVar15 + 0x15),1);
              }
              if (plVar15[0x19] != plVar15[0x18]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar15 + 0x18),1);
              }
            }
            if (plVar15 != (long *)0x0) {
              (**(code **)(*plVar15 + 0x18))(plVar15);
            }
          }
          else {
            (**(code **)(*plVar14 + 0x10))(plVar14);
            if (plVar14[0xf] != plVar14[0xe]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar14 + 0xe),1);
            }
            if (plVar14[0x12] != plVar14[0x11]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar14 + 0x11),1);
            }
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 0x18))(plVar14);
          }
        }
        else {
          (**(code **)(*plVar13 + 0x10))(plVar13);
          if (plVar13[0xf] != plVar13[0xe]) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(plVar13 + 0xe),1);
          }
          if (plVar13[0x12] != plVar13[0x11]) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(plVar13 + 0x11),1);
          }
        }
        if (plVar13 != (long *)0x0) {
          (**(code **)(*plVar13 + 0x18))(plVar13);
        }
      }
      else {
        (**(code **)(*plVar12 + 0x10))(plVar12);
        lVar21 = plVar12[0xd];
        if (plVar12[0xe] != lVar21) {
          uVar19 = 0;
          do {
            pNVar4 = *(Node **)(lVar21 + uVar19 * 8);
            local_48.ptr = pNVar4;
            if (pNVar4 != (Node *)0x0) {
              (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
            }
            convert_mblur_to_nonmblur(&local_48);
            if (pNVar4 != (Node *)0x0) {
              (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
            }
            uVar19 = uVar19 + 1;
            lVar21 = plVar12[0xd];
          } while (uVar19 < (ulong)(plVar12[0xe] - lVar21 >> 3));
        }
      }
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 0x18))(plVar12);
      }
    }
    else {
      (**(code **)(*plVar8 + 0x10))(plVar8);
      lVar21 = plVar8[0xd];
      if (plVar8[0xe] != lVar21) {
        uVar19 = 0;
        do {
          lVar21 = lVar21 + uVar19 * 0x30;
          lVar10 = *(long *)(lVar21 + 0x18) + (ulong)(*(long *)(lVar21 + 0x18) == 0);
          if (1 < *(ulong *)(lVar21 + 0x10)) {
            *(undefined8 *)(lVar21 + 0x10) = 1;
          }
          if (*(long *)(lVar21 + 0x18) == lVar10) {
            *(undefined8 *)(lVar21 + 0x10) = 1;
          }
          else {
            pvVar3 = *(void **)(lVar21 + 0x20);
            pvVar9 = alignedMalloc(lVar10 * 0x40,0x10);
            *(void **)(lVar21 + 0x20) = pvVar9;
            if (*(long *)(lVar21 + 0x10) != 0) {
              lVar11 = 0x30;
              uVar20 = 0;
              do {
                lVar5 = *(long *)(lVar21 + 0x20);
                puVar1 = (undefined8 *)((long)pvVar3 + lVar11 + -0x30);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)(lVar5 + -0x30 + lVar11);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                puVar1 = (undefined8 *)((long)pvVar3 + lVar11 + -0x20);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)(lVar5 + -0x20 + lVar11);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                puVar1 = (undefined8 *)((long)pvVar3 + lVar11 + -0x10);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)(lVar5 + -0x10 + lVar11);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                uVar6 = ((undefined8 *)((long)pvVar3 + lVar11))[1];
                *(undefined8 *)(lVar5 + lVar11) = *(undefined8 *)((long)pvVar3 + lVar11);
                ((undefined8 *)(lVar5 + lVar11))[1] = uVar6;
                uVar20 = uVar20 + 1;
                lVar11 = lVar11 + 0x40;
              } while (uVar20 < *(ulong *)(lVar21 + 0x10));
            }
            alignedFree(pvVar3);
            *(undefined8 *)(lVar21 + 0x10) = 1;
            *(long *)(lVar21 + 0x18) = lVar10;
          }
          uVar19 = uVar19 + 1;
          lVar21 = plVar8[0xd];
        } while (uVar19 < (ulong)((plVar8[0xe] - lVar21 >> 4) * -0x5555555555555555));
      }
      pNVar4 = (Node *)plVar8[0x10];
      local_40.ptr = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
      }
      convert_mblur_to_nonmblur(&local_40);
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
      }
    }
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 0x18))(plVar8);
    }
  }
  else {
    (**(code **)(*plVar7 + 0x10))(plVar7);
    lVar21 = plVar7[0x10] + (ulong)(plVar7[0x10] == 0);
    if (1 < (ulong)plVar7[0xf]) {
      plVar7[0xf] = 1;
    }
    if (plVar7[0x10] == lVar21) {
      plVar7[0xf] = 1;
    }
    else {
      pvVar3 = (void *)plVar7[0x11];
      pvVar9 = alignedMalloc(lVar21 * 0x40,0x10);
      plVar7[0x11] = (long)pvVar9;
      if (plVar7[0xf] != 0) {
        lVar10 = 0x30;
        uVar19 = 0;
        do {
          lVar11 = plVar7[0x11];
          puVar1 = (undefined8 *)((long)pvVar3 + lVar10 + -0x30);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)(lVar11 + -0x30 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)((long)pvVar3 + lVar10 + -0x20);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)(lVar11 + -0x20 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)((long)pvVar3 + lVar10 + -0x10);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)(lVar11 + -0x10 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          uVar6 = ((undefined8 *)((long)pvVar3 + lVar10))[1];
          *(undefined8 *)(lVar11 + lVar10) = *(undefined8 *)((long)pvVar3 + lVar10);
          ((undefined8 *)(lVar11 + lVar10))[1] = uVar6;
          uVar19 = uVar19 + 1;
          lVar10 = lVar10 + 0x40;
        } while (uVar19 < (ulong)plVar7[0xf]);
      }
      alignedFree(pvVar3);
      plVar7[0xf] = 1;
      plVar7[0x10] = lVar21;
    }
    pNVar4 = (Node *)plVar7[0x13];
    local_38.ptr = pNVar4;
    if (pNVar4 != (Node *)0x0) {
      (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
    }
    convert_mblur_to_nonmblur(&local_38);
    if (pNVar4 != (Node *)0x0) {
      (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
    }
  }
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x18))(plVar7);
  }
  return;
}

Assistant:

void SceneGraph::convert_mblur_to_nonmblur(Ref<Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->spaces.spaces.resize(1);
      convert_mblur_to_nonmblur(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
        xfmNode->spaces[i].spaces.resize(1);
      convert_mblur_to_nonmblur(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        convert_mblur_to_nonmblur(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
      if (mesh->tangents.size())  mesh->tangents.resize(1);
      if (mesh->dnormals.size())  mesh->dnormals.resize(1);
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals .size()) mesh->normals .resize(1);
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
      mesh->positions.resize(1);
    }
  }